

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall testing::UnitTest::RecordProperty(UnitTest *this,string *key,string *value)

{
  UnitTestImpl *this_00;
  TestProperty local_58;
  
  this_00 = this->impl_;
  TestProperty::TestProperty(&local_58,key,value);
  internal::UnitTestImpl::RecordProperty(this_00,&local_58);
  TestProperty::~TestProperty(&local_58);
  return;
}

Assistant:

void UnitTest::RecordProperty(const std::string& key,
                              const std::string& value) {
  impl_->RecordProperty(TestProperty(key, value));
}